

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O1

pcap_t * pcap_create_common(char *ebuf,size_t size)

{
  pcap_t *ppVar1;
  pcap_t *ppVar2;
  
  ppVar1 = pcap_alloc_pcap_t(ebuf,size);
  ppVar2 = (pcap_t *)0x0;
  if (ppVar1 != (pcap_t *)0x0) {
    ppVar1->can_set_rfmon_op = pcap_cant_set_rfmon;
    ppVar1->read_op = pcap_not_initialized;
    ppVar1->inject_op = pcap_not_initialized;
    ppVar1->setfilter_op = pcap_not_initialized;
    ppVar1->setdirection_op = pcap_not_initialized;
    ppVar1->set_datalink_op = pcap_not_initialized;
    ppVar1->getnonblock_op = pcap_not_initialized;
    ppVar1->setnonblock_op = pcap_not_initialized;
    ppVar1->stats_op = pcap_not_initialized;
    ppVar1->cleanup_op = pcap_cleanup_live_common;
    ppVar1->oneshot_callback = pcap_oneshot;
    ppVar1->snapshot = 0x40000;
    (ppVar1->opt).timeout = 0;
    (ppVar1->opt).buffer_size = 0;
    (ppVar1->opt).promisc = 0;
    (ppVar1->opt).rfmon = 0;
    (ppVar1->opt).immediate = 0;
    (ppVar1->opt).tstamp_type = -1;
    (ppVar1->opt).tstamp_precision = 0;
    ppVar1->bpf_codegen_flags = 0;
    ppVar2 = ppVar1;
  }
  return ppVar2;
}

Assistant:

pcap_t *
pcap_create_common(char *ebuf, size_t size)
{
	pcap_t *p;

	p = pcap_alloc_pcap_t(ebuf, size);
	if (p == NULL)
		return (NULL);

	/*
	 * Default to "can't set rfmon mode"; if it's supported by
	 * a platform, the create routine that called us can set
	 * the op to its routine to check whether a particular
	 * device supports it.
	 */
	p->can_set_rfmon_op = pcap_cant_set_rfmon;

	initialize_ops(p);

	/* put in some defaults*/
 	p->snapshot = MAXIMUM_SNAPLEN;	/* max packet size */
	p->opt.timeout = 0;		/* no timeout specified */
	p->opt.buffer_size = 0;		/* use the platform's default */
	p->opt.promisc = 0;
	p->opt.rfmon = 0;
	p->opt.immediate = 0;
	p->opt.tstamp_type = -1;	/* default to not setting time stamp type */
	p->opt.tstamp_precision = PCAP_TSTAMP_PRECISION_MICRO;

	/*
	 * Start out with no BPF code generation flags set.
	 */
	p->bpf_codegen_flags = 0;

	return (p);
}